

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

int __thiscall gmlc::utilities::numeric_conversion<int>(utilities *this,string_view V,int defValue)

{
  int iVar1;
  string_view input;
  
  input._M_len = (byte *)V._M_len;
  iVar1 = (int)V._M_str;
  if ((this != (utilities *)0x0) && (numCheck[*input._M_len] == '\x01')) {
    input._M_str = (char *)0x0;
    iVar1 = strViewToInteger<int>(this,input,(size_t *)numCheck);
  }
  return iVar1;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}